

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpReqInfo.hpp
# Opt level: O1

bool __thiscall
Husky::HttpReqInfo::_parseUrl
          (HttpReqInfo *this,string *url,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *mp)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  int iVar4;
  ulong uVar5;
  mapped_type *this_00;
  ulong uVar6;
  uint uVar7;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  key_type local_50;
  
  sVar2 = url->_M_string_length;
  if (sVar2 != 0) {
    iVar4 = std::__cxx11::string::find((char)url,0x3f);
    uVar6 = (ulong)(iVar4 + 1);
    uVar5 = url->_M_string_length;
    if (uVar6 < uVar5) {
      while (uVar7 = (uint)uVar6, uVar6 < uVar5) {
        pcVar3 = (url->_M_dataplus)._M_p;
        cVar1 = pcVar3[uVar6];
        while (cVar1 != '=') {
          uVar7 = (int)uVar6 + 1;
          uVar6 = (ulong)uVar7;
          if (uVar5 <= uVar6) goto LAB_00115170;
          cVar1 = pcVar3[uVar6];
        }
        if (uVar5 <= uVar6) break;
        uVar7 = uVar7 + 1;
        if (uVar7 < uVar5) {
          uVar6 = (ulong)uVar7;
          do {
            uVar7 = (uint)uVar6;
            cVar1 = (url->_M_dataplus)._M_p[uVar6];
            if ((cVar1 == ' ') || (cVar1 == '&')) break;
            uVar7 = uVar7 + 1;
            uVar6 = (ulong)uVar7;
          } while (uVar6 < uVar5);
        }
        std::__cxx11::string::substr((ulong)local_70,(ulong)url);
        std::__cxx11::string::substr((ulong)&local_50,(ulong)url);
        this_00 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)mp,&local_50);
        std::__cxx11::string::operator=((string *)this_00,(string *)local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if (local_70[0] != local_60) {
          operator_delete(local_70[0]);
        }
        uVar6 = (ulong)(uVar7 + 1);
        uVar5 = url->_M_string_length;
        if (uVar5 <= uVar6) break;
      }
    }
  }
LAB_00115170:
  return sVar2 != 0;
}

Assistant:

bool _parseUrl(const string& url, HashMap<string, string>& mp)
            {
                if(url.empty())
                {
                    return false;
                }

                uint pos = url.find('?');
                if(string::npos == pos)
                {
                    return false;
                }
                uint kleft = 0, kright = 0;
                uint vleft = 0, vright = 0;
                for(uint i = pos + 1; i < url.size();)
                {
                    kleft = i;
                    while(i < url.size() && url[i] != '=')
                    {
                        i++;
                    }
                    if(i >= url.size())
                    {
                        break;
                    }
                    kright = i;
                    i++;
                    vleft = i;
                    while(i < url.size() && url[i] != '&' && url[i] != ' ')
                    {
                        i++;
                    }
                    vright = i;
                    mp[url.substr(kleft, kright - kleft)] = url.substr(vleft, vright - vleft);
                    i++;
                }

                return true;
            }